

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *local_108;
  string local_e8;
  cmStateSnapshot local_c8;
  undefined1 local_b0 [8];
  cmOutputConverter converter;
  char *location;
  string arg;
  uint j;
  cmCustomCommandLine *commandLine;
  uint offset;
  string *cmd_local;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  pcVar1 = GetCrossCompilingEmulator(this,c);
  commandLine._4_4_ = (uint)(pcVar1 == (char *)0x0);
  this_00 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                       (&(this->CommandLines).
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                        (ulong)c)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  for (arg.field_2._12_4_ = commandLine._4_4_; uVar2 = (ulong)(uint)arg.field_2._12_4_,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_00), uVar2 < sVar3; arg.field_2._12_4_ = arg.field_2._12_4_ + 1) {
    std::__cxx11::string::string((string *)&location);
    if (arg.field_2._12_4_ == 0) {
      local_108 = GetArgv0Location(this,c);
    }
    else {
      local_108 = (char *)0x0;
    }
    if (local_108 == (char *)0x0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(ulong)(uint)arg.field_2._12_4_);
      std::__cxx11::string::operator=((string *)&location,(string *)pvVar4);
    }
    else {
      std::__cxx11::string::operator=((string *)&location,local_108);
    }
    std::__cxx11::string::operator+=((string *)cmd," ");
    if ((this->OldStyle & 1U) == 0) {
      cmLocalGenerator::GetStateSnapshot(&local_c8,this->LG);
      cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_b0,&local_c8);
      cmOutputConverter::EscapeForShell
                (&local_e8,(cmOutputConverter *)local_b0,(string *)&location,
                 (bool)(this->MakeVars & 1),false,false);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      escapeForShellOldStyle((string *)&converter.LinkScriptShell,(string *)&location);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&converter.LinkScriptShell);
      std::__cxx11::string::~string((string *)&converter.LinkScriptShell);
    }
    std::__cxx11::string::~string((string *)&location);
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  if (this->GetCrossCompilingEmulator(c) != CM_NULLPTR) {
    offset = 0;
  }
  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location =
          j == 0 ? this->GetArgv0Location(c) : CM_NULLPTR) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmOutputConverter converter(this->LG->GetStateSnapshot());
      cmd += converter.EscapeForShell(arg, this->MakeVars);
    }
  }
}